

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O3

void horn_relax(qnode_ptr_t p,float alpha,int n,char *fn,int prod_err)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  param512_t *papVar4;
  qnode_ptr_t ptVar5;
  qnode_ptr_t q;
  disp_field512_t *padVar6;
  long lVar7;
  float *pfVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  float fVar16;
  undefined4 in_XMM0_Db;
  undefined4 extraout_XMM0_Db;
  float fVar17;
  float fVar20;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar21;
  double dVar22;
  float std;
  float avg;
  float local_80;
  float local_7c;
  undefined8 local_78;
  disp_field512_t *local_60;
  qnode_ptr_t local_58;
  long local_50;
  long local_48;
  long local_40;
  ulong local_38;
  
  iVar2 = p->res;
  iVar11 = p->sizx;
  uVar10 = p->sizy;
  iVar3 = p->sizz;
  uVar9 = p->ofst;
  local_78 = fn;
  ptVar5 = (qnode_ptr_t)malloc(0x170);
  ptVar5->res = iVar2;
  ptVar5->sizx = iVar11;
  ptVar5->sizy = uVar10;
  ptVar5->sizz = iVar3;
  ptVar5->ofst = uVar9;
  ptVar5->level = 0;
  local_60 = (disp_field512_t *)malloc(0xc3080);
  ptVar5->flow_ptr = local_60;
  if (prod_err != 0) {
    q = (qnode_ptr_t)malloc(0x170);
    q->res = iVar2;
    q->sizx = iVar11;
    q->sizy = uVar10;
    q->sizz = iVar3;
    q->ofst = uVar9;
    q->level = 0;
    padVar6 = (disp_field512_t *)malloc(0xc3080);
    q->flow_ptr = padVar6;
    local_58 = q;
    load_velocity(q,local_78);
    uVar10 = p->sizy;
    uVar9 = p->ofst;
  }
  if ((int)uVar9 < (int)uVar10) {
    iVar11 = p->sizx;
    local_78 = (char *)(long)(int)uVar9;
    uVar15 = uVar9;
    do {
      if ((int)uVar9 < iVar11) {
        memset(*p->flow_ptr + (long)(local_78 + (long)(int)uVar15 * (long)p->res),0,
               (ulong)(~uVar9 + iVar11) * 8 + 8);
      }
      uVar15 = uVar15 + 1;
    } while (uVar10 != uVar15);
  }
  if (0 < n) {
    local_50 = (long)iVar2 * 8 + 8;
    local_48 = (long)iVar2 << 3;
    uVar10 = 0;
    do {
      iVar2 = p->ofst;
      lVar7 = (long)iVar2;
      iVar11 = p->sizy;
      if (iVar2 < iVar11) {
        iVar3 = p->sizx;
        pfVar8 = (float *)((long)&(*local_60)[0].x + local_50 * lVar7);
        lVar12 = lVar7;
        do {
          if (iVar2 < iVar3) {
            iVar14 = p->res;
            padVar6 = p->flow_ptr;
            lVar13 = 0;
            do {
              *(disp_vect_t *)(pfVar8 + lVar13 * 2) = (*padVar6)[iVar14 * lVar12 + lVar7 + lVar13];
              lVar13 = lVar13 + 1;
            } while (iVar3 - lVar7 != lVar13);
          }
          lVar12 = lVar12 + 1;
          pfVar8 = (float *)((long)pfVar8 + local_48);
        } while (lVar12 != iVar11);
      }
      if (iVar2 < iVar11 - iVar2) {
        iVar3 = p->sizx;
        local_40 = (long)iVar3 + lVar7 * -2;
        iVar14 = iVar2;
        local_38 = (ulong)(uint)(iVar11 - iVar2);
        do {
          if (iVar2 < iVar3 - iVar2) {
            papVar4 = p->param_ptr[p->sizz / 2];
            lVar13 = ((long)iVar14 * (long)p->res + lVar7) * 8;
            lVar12 = local_40;
            iVar11 = iVar2;
            do {
              if ((&(*papVar4)[0].err)[lVar13] == 0) {
                fVar21 = (&(*papVar4)[0].ft)[lVar13];
                fVar16 = lapu(ptVar5,iVar14,iVar11);
                local_78 = (char *)CONCAT44(extraout_XMM0_Db,fVar16);
                fVar16 = lapv(ptVar5,iVar14,iVar11);
                uVar1 = *(undefined8 *)(&(*papVar4)[0].fx + lVar13);
                fVar17 = (float)uVar1;
                fVar20 = (float)((ulong)uVar1 >> 0x20);
                fVar21 = fVar17 * (float)local_78 + fVar20 * fVar16 + fVar21;
                dVar22 = (double)fVar20 * (double)fVar20 + (double)fVar17 * (double)fVar17 +
                         (double)(float)(double)CONCAT44(in_XMM0_Db,alpha) *
                         (double)(float)(double)CONCAT44(in_XMM0_Db,alpha);
                auVar18._0_8_ = (double)(fVar21 * fVar17);
                auVar18._8_8_ = (double)(fVar21 * fVar20);
                auVar19._8_8_ = dVar22;
                auVar19._0_8_ = dVar22;
                auVar19 = divpd(auVar18,auVar19);
                *(ulong *)((long)&(*p->flow_ptr)[0].x + lVar13) =
                     CONCAT44((float)((double)fVar16 - auVar19._8_8_),
                              (float)((double)(float)local_78 - auVar19._0_8_));
              }
              iVar11 = iVar11 + 1;
              lVar13 = lVar13 + 8;
              lVar12 = lVar12 + -1;
            } while (lVar12 != 0);
          }
          iVar14 = iVar14 + 1;
        } while (iVar14 != (int)local_38);
      }
      uVar10 = uVar10 + 1;
      printf(" Iteration %3d :\n",(ulong)uVar10);
      if (prod_err != 0) {
        flow_error(p,local_58,&local_7c,&local_80);
        printf("    Average Angular Error : %10.5f\n",SUB84((double)local_7c,0));
        printf("       Standard Deviation : %10.5f\n",SUB84((double)local_80,0));
      }
      fVar21 = flow_l2_norm(ptVar5,p);
      printf("       L2 Norm Difference : %10.5f\n",SUB84((double)fVar21,0));
      fflush(_stdout);
    } while (uVar10 != n);
  }
  free(local_60);
  free(ptVar5);
  ptVar5 = local_58;
  if (prod_err != 0) {
    free(local_58->flow_ptr);
    free(ptVar5);
    return;
  }
  return;
}

Assistant:

void horn_relax(p,alpha,n,fn,prod_err)
qnode_ptr_t p ;
float alpha ;
int n, prod_err ;
string fn ;

{ qnode_ptr_t create_node(), q, r ;
  param_t f ;
  float lapu(), lapv(), flow_l2_norm(), u_bar, v_bar, avg, std ;
  int i, j, k ;

  q = create_node(0,p->res,p->sizx,p->sizy,p->sizz,p->ofst) ;
  q->flow_ptr = (disp_field512_t *)malloc(sizeof(disp_field512_t)) ;

  if (prod_err) {
    r = create_node(0,p->res,p->sizx,p->sizy,p->sizz,p->ofst) ;
    r->flow_ptr = (disp_field512_t *)malloc(sizeof(disp_field512_t)) ;
    load_velocity(r,fn) ;
  }

  for (i = p->ofst ; i < p->sizy ; i++) {
    for (j = p->ofst ; j < p->sizx ; j++) {
      (*p->flow_ptr)[p->res*i + j].x = 0.0 ;
      (*p->flow_ptr)[p->res*i + j].y = 0.0 ;
    }
  }
  for (k = 0 ; k < n ; k++) {
    for (i = p->ofst ; i < p->sizy ; i++) {
      for (j = p->ofst ; j < p->sizx ; j++) {
        (*q->flow_ptr)[q->res*i + j] = (*p->flow_ptr)[p->res*i + j] ;
      }
    }
    for (i = p->ofst ; i < p->sizy - p->ofst ; i++) {
      for (j = p->ofst ; j < p->sizx - p->ofst ; j++) {
        if ((*p->param_ptr[p->sizz/2])[p->res*i + j].err == NO_ERROR) {
          f = (*p->param_ptr[p->sizz/2])[p->res*i + j] ;

          u_bar = lapu(q,i,j) ;
          v_bar = lapv(q,i,j) ;

          (*p->flow_ptr)[p->res*i + j].x =
          u_bar - f.fx*(f.fx*u_bar + f.fy*v_bar + f.ft)
          /(pow(f.fx,2.0) + pow(f.fy,2.0) + pow(alpha,2.0)) ;

          (*p->flow_ptr)[p->res*i + j].y =
          v_bar - f.fy*(f.fx*u_bar + f.fy*v_bar + f.ft)
          /(pow(f.fx,2.0) + pow(f.fy,2.0) + pow(alpha,2.0)) ;
        }
      }
    }
    printf(" Iteration %3d :\n",k+1) ;
    if (prod_err) {
      flow_error(p,r,&avg,&std) ;
      printf("    Average Angular Error : %10.5f\n",avg) ;
      printf("       Standard Deviation : %10.5f\n",std) ;
    }
    printf("       L2 Norm Difference : %10.5f\n",flow_l2_norm(q,p)) ;
    fflush(stdout) ;
  }
  free((disp_field512_t *)q->flow_ptr) ;
  free(q) ;
  if (prod_err) {
    free((disp_field512_t *)r->flow_ptr) ;
    free(r) ;
  }
}